

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::LoadInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::LoadInst>,LLVMBC::LoadInst*&>
          (LLVMContext *this,LoadInst **u)

{
  TypedDeleter<LLVMBC::LoadInst> *this_00;
  TypedDeleter<LLVMBC::LoadInst> *t;
  TypedDeleter<LLVMBC::LoadInst> *mem;
  LoadInst **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::LoadInst> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::LoadInst> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::LoadInst>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}